

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_json.c
# Opt level: O1

char * parse_string(cJSON *item,char *str)

{
  char cVar1;
  undefined8 in_RAX;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  undefined8 local_38;
  uint uc2;
  uint uc;
  
  pcVar2 = str;
  if (*str == '\"') {
    sVar5 = 1;
    pcVar6 = str + 1;
    for (pcVar2 = pcVar6; (cVar1 = *pcVar2, cVar1 != '\0' && (cVar1 != '\"'));
        pcVar2 = pcVar2 + (ulong)(cVar1 == '\\') + 1) {
      sVar5 = sVar5 + 1;
    }
    local_38 = in_RAX;
    pcVar3 = (char *)(*cJSON_malloc)(sVar5);
    pcVar7 = pcVar3;
    pcVar2 = ep;
    if (pcVar3 != (char *)0x0) {
LAB_0017f186:
      cVar1 = *pcVar6;
      if (cVar1 == '\\') {
        cVar1 = pcVar6[1];
        switch(cVar1) {
        case 'n':
          *pcVar7 = '\n';
          break;
        case 'o':
        case 'p':
        case 'q':
        case 's':
switchD_0017f1c9_caseD_6f:
          *pcVar7 = cVar1;
          break;
        case 'r':
          *pcVar7 = '\r';
          break;
        case 't':
          *pcVar7 = '\t';
          break;
        case 'u':
          __isoc99_sscanf(pcVar6 + 2,"%4x",(long)&local_38 + 4);
          pcVar2 = pcVar6 + 5;
          if (local_38._4_4_ != 0 && (local_38._4_4_ & 0xfffffc00) != 0xdc00) {
            if ((local_38._4_4_ & 0xfffffc00) != 0xd800) goto LAB_0017f29b;
            if ((pcVar6[6] == '\\') && (pcVar6[7] == 'u')) {
              __isoc99_sscanf(pcVar6 + 8,"%4x",&local_38);
              pcVar2 = pcVar6 + 0xb;
              if ((uint)local_38 - 0xe000 < 0xfffffc00) goto LAB_0017f342;
              local_38 = CONCAT44(((uint)local_38 & 0x3ff) + (local_38._4_4_ & 0x3ff) * 0x400 +
                                  0x10000,(uint)local_38);
LAB_0017f29b:
              iVar4 = 1;
              if ((0x7f < local_38._4_4_) && (iVar4 = 2, 0x7ff < local_38._4_4_)) {
                iVar4 = 4 - (uint)(local_38._4_4_ < 0x10000);
              }
              pcVar2 = (char *)(*(code *)((long)&DAT_001a47fc +
                                         (long)(int)(&DAT_001a47fc)[iVar4 - 1]))
                                         (&DAT_001a47fc,
                                          (code *)((long)&DAT_001a47fc +
                                                  (long)(int)(&DAT_001a47fc)[iVar4 - 1]),
                                          local_38._4_4_,iVar4);
              return pcVar2;
            }
          }
          goto LAB_0017f342;
        default:
          if (cVar1 == 'f') {
            *pcVar7 = '\f';
          }
          else {
            if (cVar1 != 'b') goto switchD_0017f1c9_caseD_6f;
            *pcVar7 = '\b';
          }
        }
        pcVar7 = pcVar7 + 1;
        pcVar2 = pcVar6 + 1;
      }
      else {
        if ((cVar1 == '\0') || (cVar1 == '\"')) {
          *pcVar7 = '\0';
          cVar1 = *pcVar6;
          item->valuestring = pcVar3;
          item->type = 4;
          return pcVar6 + (cVar1 == '\"');
        }
        *pcVar7 = cVar1;
        pcVar7 = pcVar7 + 1;
        pcVar2 = pcVar6;
      }
LAB_0017f342:
      pcVar6 = pcVar2 + 1;
      goto LAB_0017f186;
    }
  }
  ep = pcVar2;
  return (char *)0x0;
}

Assistant:

static const char *parse_string(cJSON *item,const char *str)
{
	const char *ptr=str+1;char *ptr2;char *out;int len=0;unsigned uc,uc2;
	if (*str!='\"') {ep=str;return 0;}	/* not a string! */
	
	while (*ptr!='\"' && *ptr && ++len) if (*ptr++ == '\\') ptr++;	/* Skip escaped quotes. */
	
	out=(char*)cJSON_malloc(len+1);	/* This is how long we need for the string, roughly. */
	if (!out) return 0;
	
	ptr=str+1;ptr2=out;
	while (*ptr!='\"' && *ptr)
	{
		if (*ptr!='\\') *ptr2++=*ptr++;
		else
		{
			ptr++;
			switch (*ptr)
			{
				case 'b': *ptr2++='\b';	break;
				case 'f': *ptr2++='\f';	break;
				case 'n': *ptr2++='\n';	break;
				case 'r': *ptr2++='\r';	break;
				case 't': *ptr2++='\t';	break;
				case 'u':	 /* transcode utf16 to utf8. */
					sscanf(ptr+1,"%4x",&uc);ptr+=4;	/* get the unicode char. */

					if ((uc>=0xDC00 && uc<=0xDFFF) || uc==0)	break;	/* check for invalid.	*/

					if (uc>=0xD800 && uc<=0xDBFF)	/* UTF16 surrogate pairs.	*/
					{
						if (ptr[1]!='\\' || ptr[2]!='u')	break;	/* missing second-half of surrogate.	*/
						sscanf(ptr+3,"%4x",&uc2);ptr+=6;
						if (uc2<0xDC00 || uc2>0xDFFF)		break;	/* invalid second-half of surrogate.	*/
						uc=0x10000 + (((uc&0x3FF)<<10) | (uc2&0x3FF));
					}

					len=4;if (uc<0x80) len=1;else if (uc<0x800) len=2;else if (uc<0x10000) len=3; ptr2+=len;
					
					switch (len) {
						case 4: *--ptr2 =((uc | 0x80) & 0xBF); uc >>= 6;
						case 3: *--ptr2 =((uc | 0x80) & 0xBF); uc >>= 6;
						case 2: *--ptr2 =((uc | 0x80) & 0xBF); uc >>= 6;
						case 1: *--ptr2 =(uc | firstByteMark[len]);
					}
					ptr2+=len;
					break;
				default:  *ptr2++=*ptr; break;
			}
			ptr++;
		}
	}
	*ptr2=0;
	if (*ptr=='\"') ptr++;
	item->valuestring=out;
	item->type=cJSON_String;
	return ptr;
}